

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
vectype_from_base(Context_conflict *ctx,MOJOSHADER_astDataType *base,int len)

{
  MOJOSHADER_astDataType *datatype;
  char buf [32];
  char *local_30;
  char *typestr;
  int len_local;
  MOJOSHADER_astDataType *base_local;
  Context_conflict *ctx_local;
  
  if (len < 1) {
    __assert_fail("len > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                  ,0xa03,
                  "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                 );
  }
  if (len < 5) {
    ctx_local = (Context_conflict *)base;
    if (len != 1) {
      switch(base->type) {
      case MOJOSHADER_AST_DATATYPE_BOOL:
        local_30 = "bool";
        break;
      case MOJOSHADER_AST_DATATYPE_INT:
        local_30 = "int";
        break;
      case MOJOSHADER_AST_DATATYPE_UINT:
        local_30 = "uint";
        break;
      case MOJOSHADER_AST_DATATYPE_FLOAT:
        local_30 = "float";
        break;
      default:
        __assert_fail("0 && \"This shouldn\'t happen\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0xa12,
                      "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                     );
      case MOJOSHADER_AST_DATATYPE_HALF:
        local_30 = "half";
        break;
      case MOJOSHADER_AST_DATATYPE_DOUBLE:
        local_30 = "double";
      }
      snprintf((char *)&datatype,0x20,"%s%d",local_30,(ulong)(uint)len);
      ctx_local = (Context_conflict *)get_usertype(ctx,(char *)&datatype);
      if ((MOJOSHADER_astDataType *)ctx_local == (MOJOSHADER_astDataType *)0x0) {
        __assert_fail("datatype != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0xa18,
                      "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
                     );
      }
    }
    return (MOJOSHADER_astDataType *)ctx_local;
  }
  __assert_fail("len <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                ,0xa04,
                "const MOJOSHADER_astDataType *vectype_from_base(Context *, const MOJOSHADER_astDataType *, const int)"
               );
}

Assistant:

static const MOJOSHADER_astDataType *vectype_from_base(Context *ctx,
                                            const MOJOSHADER_astDataType *base,
                                            const int len)
{
    assert(len > 0);
    assert(len <= 4);

    if (len == 1)  // return "float" and not "float1"
        return base;

    const char *typestr = NULL;
    switch (base->type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL: typestr = "bool"; break;
        case MOJOSHADER_AST_DATATYPE_INT: typestr = "int"; break;
        case MOJOSHADER_AST_DATATYPE_UINT: typestr = "uint"; break;
        case MOJOSHADER_AST_DATATYPE_HALF: typestr = "half"; break;
        case MOJOSHADER_AST_DATATYPE_FLOAT: typestr = "float"; break;
        case MOJOSHADER_AST_DATATYPE_DOUBLE: typestr = "double"; break;
        default: assert(0 && "This shouldn't happen"); break;
    } // switch

    char buf[32];
    snprintf(buf, sizeof (buf), "%s%d", typestr, len);
    const MOJOSHADER_astDataType *datatype = get_usertype(ctx, buf);
    assert(datatype != NULL);
    return datatype;
}